

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

char * fts5ExprPrint(Fts5Config *pConfig,Fts5ExprNode *pExpr)

{
  int iVar1;
  Fts5ExprNearset *pFVar2;
  Fts5ExprPhrase *pFVar3;
  char *pcVar4;
  char *pcVar5;
  char *pcVar6;
  bool bVar7;
  char *local_88;
  int b;
  int e;
  char *z;
  char *pcStack_58;
  int i_1;
  char *zOp;
  char *zTerm;
  Fts5ExprPhrase *pPhrase;
  int local_38;
  int iCol;
  int iTerm;
  int i;
  Fts5ExprNearset *pNear;
  char *zRet;
  Fts5ExprNode *pExpr_local;
  Fts5Config *pConfig_local;
  
  pNear = (Fts5ExprNearset *)0x0;
  if (pExpr->eType == 0) {
    pcVar4 = sqlite3_mprintf("\"\"");
    return pcVar4;
  }
  if ((pExpr->eType == 9) || (pExpr->eType == 4)) {
    pFVar2 = pExpr->pNear;
    if ((pFVar2->pColset != (Fts5Colset *)0x0) &&
       (pNear = (Fts5ExprNearset *)
                fts5PrintfAppend((char *)0x0,"%s : ",pConfig->azCol[pFVar2->pColset->aiCol[0]]),
       pNear == (Fts5ExprNearset *)0x0)) {
      return (char *)0x0;
    }
    if ((1 < pFVar2->nPhrase) &&
       (pNear = (Fts5ExprNearset *)fts5PrintfAppend((char *)pNear,"NEAR("),
       pNear == (Fts5ExprNearset *)0x0)) {
      return (char *)0x0;
    }
    for (iCol = 0; iCol < pFVar2->nPhrase; iCol = iCol + 1) {
      pFVar3 = pFVar2->apPhrase[iCol];
      if ((iCol != 0) &&
         (pNear = (Fts5ExprNearset *)fts5PrintfAppend((char *)pNear," "),
         pNear == (Fts5ExprNearset *)0x0)) {
        return (char *)0x0;
      }
      for (local_38 = 0; local_38 < pFVar3->nTerm; local_38 = local_38 + 1) {
        pcVar4 = fts5ExprTermPrint(pFVar3->aTerm + local_38);
        if (pcVar4 != (char *)0x0) {
          pcVar5 = " + ";
          if (local_38 == 0) {
            pcVar5 = "";
          }
          pNear = (Fts5ExprNearset *)fts5PrintfAppend((char *)pNear,"%s%s",pcVar5,pcVar4);
          sqlite3_free(pcVar4);
        }
        if ((pcVar4 == (char *)0x0) || (pNear == (Fts5ExprNearset *)0x0)) {
          sqlite3_free(pNear);
          return (char *)0x0;
        }
      }
    }
    if ((1 < pFVar2->nPhrase) &&
       (pNear = (Fts5ExprNearset *)
                fts5PrintfAppend((char *)pNear,", %d)",(ulong)(uint)pFVar2->nNear),
       pNear == (Fts5ExprNearset *)0x0)) {
      return (char *)0x0;
    }
  }
  else {
    if (pExpr->eType == 2) {
      pcStack_58 = " AND ";
    }
    else if (pExpr->eType == 3) {
      pcStack_58 = " NOT ";
    }
    else {
      pcStack_58 = " OR ";
    }
    for (z._4_4_ = 0; z._4_4_ < pExpr->nChild; z._4_4_ = z._4_4_ + 1) {
      pcVar4 = fts5ExprPrint(pConfig,pExpr->apChild[z._4_4_]);
      if (pcVar4 == (char *)0x0) {
        sqlite3_free(pNear);
        pNear = (Fts5ExprNearset *)0x0;
      }
      else {
        iVar1 = pExpr->apChild[z._4_4_]->eType;
        bVar7 = false;
        if ((iVar1 != 9) && (bVar7 = false, iVar1 != 4)) {
          bVar7 = iVar1 != 0;
        }
        if (z._4_4_ == 0) {
          local_88 = "";
        }
        else {
          local_88 = pcStack_58;
        }
        pcVar5 = "";
        if (bVar7) {
          pcVar5 = "(";
        }
        pcVar6 = "";
        if (bVar7) {
          pcVar6 = ")";
        }
        pNear = (Fts5ExprNearset *)
                fts5PrintfAppend((char *)pNear,"%s%s%z%s",local_88,pcVar5,pcVar4,pcVar6);
      }
      if (pNear == (Fts5ExprNearset *)0x0) {
        return (char *)(Fts5ExprNearset *)0x0;
      }
    }
  }
  return (char *)pNear;
}

Assistant:

static char *fts5ExprPrint(Fts5Config *pConfig, Fts5ExprNode *pExpr){
  char *zRet = 0;
  if( pExpr->eType==0 ){
    return sqlite3_mprintf("\"\"");
  }else
  if( pExpr->eType==FTS5_STRING || pExpr->eType==FTS5_TERM ){
    Fts5ExprNearset *pNear = pExpr->pNear;
    int i; 
    int iTerm;

    if( pNear->pColset ){
      int iCol = pNear->pColset->aiCol[0];
      zRet = fts5PrintfAppend(zRet, "%s : ", pConfig->azCol[iCol]);
      if( zRet==0 ) return 0;
    }

    if( pNear->nPhrase>1 ){
      zRet = fts5PrintfAppend(zRet, "NEAR(");
      if( zRet==0 ) return 0;
    }

    for(i=0; i<pNear->nPhrase; i++){
      Fts5ExprPhrase *pPhrase = pNear->apPhrase[i];
      if( i!=0 ){
        zRet = fts5PrintfAppend(zRet, " ");
        if( zRet==0 ) return 0;
      }
      for(iTerm=0; iTerm<pPhrase->nTerm; iTerm++){
        char *zTerm = fts5ExprTermPrint(&pPhrase->aTerm[iTerm]);
        if( zTerm ){
          zRet = fts5PrintfAppend(zRet, "%s%s", iTerm==0?"":" + ", zTerm);
          sqlite3_free(zTerm);
        }
        if( zTerm==0 || zRet==0 ){
          sqlite3_free(zRet);
          return 0;
        }
      }
    }

    if( pNear->nPhrase>1 ){
      zRet = fts5PrintfAppend(zRet, ", %d)", pNear->nNear);
      if( zRet==0 ) return 0;
    }

  }else{
    char const *zOp = 0;
    int i;

    switch( pExpr->eType ){
      case FTS5_AND: zOp = " AND "; break;
      case FTS5_NOT: zOp = " NOT "; break;
      default:  
        assert( pExpr->eType==FTS5_OR );
        zOp = " OR "; 
        break;
    }

    for(i=0; i<pExpr->nChild; i++){
      char *z = fts5ExprPrint(pConfig, pExpr->apChild[i]);
      if( z==0 ){
        sqlite3_free(zRet);
        zRet = 0;
      }else{
        int e = pExpr->apChild[i]->eType;
        int b = (e!=FTS5_STRING && e!=FTS5_TERM && e!=FTS5_EOF);
        zRet = fts5PrintfAppend(zRet, "%s%s%z%s", 
            (i==0 ? "" : zOp),
            (b?"(":""), z, (b?")":"")
        );
      }
      if( zRet==0 ) break;
    }
  }

  return zRet;
}